

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::StencilTexturing::FunctionalTest::test
          (FunctionalTest *this,GLenum internal_format,bool is_stencil)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint program_id;
  GLuint src_texture_id;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  FunctionalTest *pFVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  GLuint local_84;
  bool local_7d;
  GLuint local_7c;
  GLuint local_78;
  GLuint local_74;
  GLuint local_70;
  GLenum local_6c;
  GLuint local_68;
  uint local_64;
  long local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  FunctionalTest *local_38;
  
  pFVar6 = (FunctionalTest *)((this->super_TestCase).m_context)->m_renderCtx;
  iVar3 = (*(pFVar6->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c = internal_format;
  prepareSourceTextureData(pFVar6,internal_format,&local_58);
  local_74 = 0;
  local_70 = 0;
  local_7c = 0;
  local_78 = 0;
  local_60 = CONCAT44(extraout_var,iVar3);
  bVar2 = Utils::isExtensionSupported((this->super_TestCase).m_context,"GL_ARB_compute_shader");
  local_7d = true;
  local_64 = (uint)is_stencil;
  GVar5 = 0;
  local_7c = 0;
  local_78 = 0;
  local_38 = this;
  if (bVar2) {
    local_74 = 0;
    local_70 = 0;
    local_7c = 0;
    local_78 = 0;
    GVar4 = prepareDestinationTexture(this,is_stencil);
    local_70 = 0;
    local_74 = 0;
    local_7c = 0;
    local_78 = GVar4;
    local_7c = prepareProgram(this,false,is_stencil);
    local_74 = 0;
    local_78 = GVar4;
    local_68 = local_7c;
    GVar5 = prepareSourceTexture(this,local_6c,is_stencil,&local_58);
    local_7c = local_68;
    local_78 = GVar4;
    local_74 = GVar5;
    dispatch(this,local_68,is_stencil,GVar4,GVar5);
    local_7c = local_68;
    local_78 = GVar4;
    local_74 = GVar5;
    local_7d = verifyTexture(this,GVar4,local_6c,is_stencil,&local_58);
    local_7c = local_68;
    local_78 = GVar4;
  }
  pFVar6 = local_38;
  local_70 = 0;
  local_74 = GVar5;
  GVar4 = prepareDestinationTexture(local_38,is_stencil);
  local_70 = GVar4;
  program_id = prepareProgram(pFVar6,true,SUB41(local_64,0));
  local_70 = GVar4;
  src_texture_id = prepareSourceTexture(pFVar6,local_6c,SUB41(local_64,0),&local_58);
  local_70 = GVar4;
  draw(pFVar6,program_id,GVar4,src_texture_id);
  local_70 = GVar4;
  bVar2 = verifyTexture(pFVar6,GVar4,local_6c,SUB41(local_64,0),&local_58);
  lVar1 = local_60;
  local_6c = CONCAT31(local_6c._1_3_,bVar2);
  (**(code **)(local_60 + 0xd8))(0);
  GVar5 = local_7c;
  (**(code **)(lVar1 + 0x78))(0x8ca9,0);
  (**(code **)(lVar1 + 0x1680))(0);
  iVar3 = (*((pFVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (GVar5 != 0) {
    (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x448))(GVar5);
  }
  iVar3 = (*((pFVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (program_id != 0) {
    (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x448))(program_id);
  }
  local_84 = local_78;
  iVar3 = (*((pFVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (local_84 != 0) {
    (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x480))(1,&local_84);
  }
  local_84 = local_74;
  iVar3 = (*((pFVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (local_84 != 0) {
    (**(code **)(CONCAT44(extraout_var_03,iVar3) + 0x480))(1,&local_84);
  }
  local_84 = GVar4;
  iVar3 = (*((pFVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (local_84 != 0) {
    (**(code **)(CONCAT44(extraout_var_04,iVar3) + 0x480))(1,&local_84);
  }
  local_84 = src_texture_id;
  iVar3 = (*((pFVar6->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (local_84 != 0) {
    (**(code **)(CONCAT44(extraout_var_05,iVar3) + 0x480))(1,&local_84);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(local_7d & (byte)local_6c);
}

Assistant:

bool FunctionalTest::test(GLenum internal_format, bool is_stencil)
{
	GLuint				 compute_dst_tex_id = 0;
	GLuint				 compute_program_id = 0;
	GLuint				 compute_src_tex_id = 0;
	GLuint				 draw_dst_tex_id	= 0;
	GLuint				 draw_program_id	= 0;
	GLuint				 draw_src_tex_id	= 0;
	const Functions&	 gl					= m_context.getRenderContext().getFunctions();
	bool				 test_result		= true;
	std::vector<GLubyte> texture_data;

	prepareSourceTextureData(internal_format, texture_data);

	try
	{
		if (true == Utils::isExtensionSupported(m_context, "GL_ARB_compute_shader"))
		{
			compute_dst_tex_id = prepareDestinationTexture(is_stencil);
			compute_program_id = prepareProgram(false, is_stencil);
			compute_src_tex_id = prepareSourceTexture(internal_format, is_stencil, texture_data);

			dispatch(compute_program_id, is_stencil, compute_dst_tex_id, compute_src_tex_id);

			if (false == verifyTexture(compute_dst_tex_id, internal_format, is_stencil, texture_data))
			{
				test_result = false;
			}
		}

		{
			draw_dst_tex_id = prepareDestinationTexture(is_stencil);
			draw_program_id = prepareProgram(true, is_stencil);
			draw_src_tex_id = prepareSourceTexture(internal_format, is_stencil, texture_data);

			draw(draw_program_id, draw_dst_tex_id, draw_src_tex_id);

			if (false == verifyTexture(draw_dst_tex_id, internal_format, is_stencil, texture_data))
			{
				test_result = false;
			}
		}
	}
	catch (std::exception& exc)
	{
		gl.bindVertexArray(0);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
		gl.useProgram(0);

		Utils::deleteProgram(m_context, compute_program_id);
		Utils::deleteProgram(m_context, draw_program_id);

		Utils::deleteTexture(m_context, compute_dst_tex_id);
		Utils::deleteTexture(m_context, compute_src_tex_id);
		Utils::deleteTexture(m_context, draw_dst_tex_id);
		Utils::deleteTexture(m_context, draw_src_tex_id);

		TCU_FAIL(exc.what());
	}

	gl.bindVertexArray(0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.useProgram(0);

	Utils::deleteProgram(m_context, compute_program_id);
	Utils::deleteProgram(m_context, draw_program_id);

	Utils::deleteTexture(m_context, compute_dst_tex_id);
	Utils::deleteTexture(m_context, compute_src_tex_id);
	Utils::deleteTexture(m_context, draw_dst_tex_id);
	Utils::deleteTexture(m_context, draw_src_tex_id);

	/* Done */
	return test_result;
}